

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulePropertiesDialog.cpp
# Opt level: O0

void __thiscall
ModulePropertiesDialog::ModulePropertiesDialog
          (ModulePropertiesDialog *this,Module *mod,SongListModel *model,QWidget *parent)

{
  QRadioButton *pQVar1;
  QGroupBox *pQVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  QListView *pQVar6;
  QPushButton *pQVar7;
  QLineEdit *pQVar8;
  QSpinBox *pQVar9;
  QDialogButtonBox *pQVar10;
  QButtonGroup *pQVar11;
  QVBoxLayout *pQVar12;
  QGroupBox *pQVar13;
  QHBoxLayout *pQVar14;
  QFrame *pQVar15;
  QRadioButton *pQVar16;
  QLabel *pQVar17;
  Module *pMVar18;
  InfoStr *pIVar19;
  QObject *context;
  anon_class_8_1_8991fb9c_for_function slot;
  anon_class_8_1_8991fb9c_for_function slot_00;
  ConnectionType type;
  Object local_580 [8];
  QObject *local_578;
  ModulePropertiesDialog *local_568;
  code *local_560;
  undefined8 local_558;
  Object local_550 [8];
  ModulePropertiesDialog *local_548;
  anon_class_8_1_8991fb9c_for_function setSystemDirty;
  Object local_528 [8];
  code *local_520;
  undefined8 local_518;
  ModulePropertiesDialog *local_510;
  Object local_508 [8];
  code *local_500;
  undefined8 local_4f8;
  ModulePropertiesDialog *local_4f0;
  Object local_4e8 [8];
  ModulePropertiesDialog *local_4e0;
  anon_class_8_1_8991fb9c_for_function setInfoDirty;
  Object local_4b8 [8];
  code *local_4b0;
  undefined8 uStack_4a8;
  code *local_4a0;
  undefined8 local_498;
  Object local_490 [8];
  code *local_488;
  undefined8 uStack_480;
  code *local_478;
  undefined8 local_470;
  Object local_468 [8];
  code *local_460;
  undefined8 uStack_458;
  code *local_450;
  undefined8 local_448;
  Object local_440 [8];
  code *local_438;
  undefined8 uStack_430;
  code *local_428;
  undefined8 local_420;
  Object local_418 [8];
  code *local_410;
  undefined8 uStack_408;
  code *local_400;
  undefined8 local_3f8;
  Object local_3f0 [15];
  anon_class_1_0_00000001 local_3e1;
  Module *pMStack_3e0;
  anon_class_1_0_00000001 setInfoEdit;
  Module *moddata;
  Object local_3b8 [8];
  offset_in_QItemSelectionModel_to_subr local_3b0;
  QItemSelectionModel *selectionModel;
  QString local_390;
  QString local_378;
  QFlags<Qt::AlignmentFlag> local_360;
  QFlags<Qt::AlignmentFlag> local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  code *local_348;
  undefined8 local_340;
  Object local_338 [8];
  undefined8 local_330;
  undefined8 uStack_328;
  code *local_320;
  undefined8 local_318;
  Object local_310 [11];
  undefined1 local_305;
  QFlags<Qt::WindowType> local_304;
  QString local_300;
  QString local_2e8;
  QString local_2d0;
  type local_2b8;
  QLabel *local_2a0;
  QLabel *moduleVersionLabel;
  QFlags<Qt::AlignmentFlag> local_290;
  QFlags<Qt::AlignmentFlag> local_28c;
  QFlags<Qt::AlignmentFlag> local_288;
  QFlags<Qt::AlignmentFlag> local_284;
  QFlags<Qt::AlignmentFlag> local_280;
  QFlags<Qt::AlignmentFlag> local_27c;
  QString local_278;
  undefined1 local_259;
  QString local_258;
  QRadioButton *local_240;
  QRadioButton *customRadio;
  QHBoxLayout *customLayout;
  QString local_228;
  QRadioButton *local_210;
  QRadioButton *sgbRadio;
  QString local_200;
  QRadioButton *local_1e8;
  QRadioButton *dmgRadio;
  QVBoxLayout *framerateLayout;
  QString local_1d0;
  QGroupBox *local_1b8;
  QGroupBox *framerateGroup;
  QFlags<Qt::AlignmentFlag> local_1a8;
  QFlags<Qt::AlignmentFlag> local_1a4;
  QVBoxLayout *local_1a0;
  QVBoxLayout *infoLayout;
  QString local_190;
  QGroupBox *local_178;
  QGroupBox *infoGroup;
  QHBoxLayout *propLayout;
  QFlags<Qt::AlignmentFlag> local_160;
  QFlags<Qt::AlignmentFlag> local_15c;
  QFlags<Qt::AlignmentFlag> local_158;
  QFlags<Qt::WindowType> local_154;
  QFrame *local_150;
  QFrame *line;
  QFlags<Qt::AlignmentFlag> local_140;
  QFlags<Qt::AlignmentFlag> local_13c;
  QVBoxLayout *local_138;
  QVBoxLayout *songButtonLayout;
  QHBoxLayout *songListLayout;
  QString local_120;
  QGroupBox *local_108;
  QGroupBox *songListGroup;
  QVBoxLayout *layout;
  Int local_e0;
  undefined1 local_d9;
  QString local_d8;
  undefined1 local_b9;
  QString local_b8;
  undefined1 local_99;
  QString local_98;
  undefined1 local_79;
  QString local_78;
  undefined1 local_59;
  QString local_58;
  QFlags<Qt::WindowType> local_30;
  Int local_2c;
  QWidget *local_28;
  QWidget *parent_local;
  SongListModel *model_local;
  Module *mod_local;
  ModulePropertiesDialog *this_local;
  
  local_28 = parent;
  parent_local = (QWidget *)model;
  model_local = (SongListModel *)mod;
  mod_local = (Module *)this;
  local_30 = Qt::operator|(WindowTitleHint,WindowSystemMenuHint);
  local_2c = (Int)QFlags<Qt::WindowType>::operator|(&local_30,WindowCloseButtonHint);
  QDialog::QDialog(&this->super_QDialog,parent,(QFlags_conflict1 *)(ulong)local_2c);
  *(undefined ***)this = &PTR_metaObject_002d5108;
  *(undefined ***)&this->field_0x10 = &PTR__ModulePropertiesDialog_002d52e0;
  this->mModule = (Module *)model_local;
  this->mModel = (SongListModel *)parent_local;
  this->mDirty = 0;
  this->mWarnRemove = true;
  pQVar6 = (QListView *)operator_new(0x28);
  QListView::QListView(pQVar6,(QWidget *)0x0);
  this->mSongList = pQVar6;
  pQVar7 = (QPushButton *)operator_new(0x28);
  local_59 = 1;
  tr(&local_58,"Add",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)&local_58,(QWidget *)0x0);
  local_59 = 0;
  QString::~QString(&local_58);
  this->mAddButton = pQVar7;
  pQVar7 = (QPushButton *)operator_new(0x28);
  local_79 = 1;
  tr(&local_78,"Remove",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)&local_78,(QWidget *)0x0);
  local_79 = 0;
  QString::~QString(&local_78);
  this->mRemoveButton = pQVar7;
  pQVar7 = (QPushButton *)operator_new(0x28);
  local_99 = 1;
  tr(&local_98,"Duplicate",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)&local_98,(QWidget *)0x0);
  local_99 = 0;
  QString::~QString(&local_98);
  this->mDuplicateButton = pQVar7;
  pQVar7 = (QPushButton *)operator_new(0x28);
  local_b9 = 1;
  tr(&local_b8,"Move up",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)&local_b8,(QWidget *)0x0);
  local_b9 = 0;
  QString::~QString(&local_b8);
  this->mMoveUpButton = pQVar7;
  pQVar7 = (QPushButton *)operator_new(0x28);
  local_d9 = 1;
  tr(&local_d8,"Move down",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)&local_d8,(QWidget *)0x0);
  local_d9 = 0;
  QString::~QString(&local_d8);
  this->mMoveDownButton = pQVar7;
  pQVar8 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar8,(QWidget *)0x0);
  this->mTitleEdit = pQVar8;
  pQVar8 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar8,(QWidget *)0x0);
  this->mArtistEdit = pQVar8;
  pQVar8 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar8,(QWidget *)0x0);
  this->mCopyrightEdit = pQVar8;
  pQVar9 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar9,(QWidget *)0x0);
  this->mCustomSpin = pQVar9;
  pQVar10 = (QDialogButtonBox *)operator_new(0x28);
  local_e0 = (Int)::operator|(FirstButton,Cancel);
  QDialogButtonBox::QDialogButtonBox(pQVar10,(QFlags_conflict1 *)(ulong)local_e0,(QWidget *)0x0);
  this->mDialogButtons = pQVar10;
  pQVar11 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar11,(QObject *)this);
  this->mFramerateRadios = pQVar11;
  QDialog::setModal(SUB81(this,0));
  tr((QString *)&layout,"Module properties",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QString::~QString((QString *)&layout);
  pQVar12 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar12);
  songListGroup = (QGroupBox *)pQVar12;
  pQVar13 = (QGroupBox *)operator_new(0x28);
  songListLayout._7_1_ = 1;
  tr(&local_120,"Song list",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar13,(QString *)&local_120,(QWidget *)0x0);
  songListLayout._7_1_ = 0;
  QString::~QString(&local_120);
  local_108 = pQVar13;
  pQVar14 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar14);
  songButtonLayout = (QVBoxLayout *)pQVar14;
  (**(code **)(*(long *)this->mSongList + 0x1c8))(this->mSongList,parent_local);
  pQVar12 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar12);
  pQVar7 = this->mAddButton;
  local_138 = pQVar12;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_13c);
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pQVar12 = local_138;
  pQVar7 = this->mRemoveButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_140);
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pQVar12 = local_138;
  pQVar7 = this->mDuplicateButton;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&line + 4));
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pQVar15 = (QFrame *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags(&local_154);
  QFrame::QFrame(pQVar15,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_154.i);
  local_150 = pQVar15;
  QFrame::setFrameShape((Shape)pQVar15);
  QFrame::setFrameShadow((Shadow)local_150);
  pQVar12 = local_138;
  pQVar15 = local_150;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_158);
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar15,(QFlags_conflict1 *)0x0);
  pQVar12 = local_138;
  pQVar7 = this->mMoveUpButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_15c);
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pQVar12 = local_138;
  pQVar7 = this->mMoveDownButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_160);
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar7,(QFlags_conflict1 *)0x0);
  QBoxLayout::addStretch((int)local_138);
  pQVar12 = songButtonLayout;
  pQVar6 = this->mSongList;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&propLayout + 4));
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar6,(QFlags_conflict1 *)0x1);
  QBoxLayout::addLayout((QLayout *)songButtonLayout,(int)local_138);
  QWidget::setLayout((QLayout *)local_108);
  pQVar14 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar14);
  infoGroup = (QGroupBox *)pQVar14;
  pQVar13 = (QGroupBox *)operator_new(0x28);
  infoLayout._7_1_ = 1;
  tr(&local_190,"Information",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar13,(QString *)&local_190,(QWidget *)0x0);
  infoLayout._7_1_ = 0;
  QString::~QString(&local_190);
  local_178 = pQVar13;
  pQVar12 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar12);
  pQVar8 = this->mTitleEdit;
  local_1a0 = pQVar12;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_1a4);
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar8,(QFlags_conflict1 *)0x0);
  pQVar12 = local_1a0;
  pQVar8 = this->mArtistEdit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_1a8);
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar8,(QFlags_conflict1 *)0x0);
  pQVar12 = local_1a0;
  pQVar8 = this->mCopyrightEdit;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&framerateGroup + 4));
  QBoxLayout::addWidget((QWidget *)pQVar12,(int)pQVar8,(QFlags_conflict1 *)0x0);
  QWidget::setLayout((QLayout *)local_178);
  pQVar13 = (QGroupBox *)operator_new(0x28);
  framerateLayout._7_1_ = 1;
  tr(&local_1d0,"Framerate",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar13,(QString *)&local_1d0,(QWidget *)0x0);
  framerateLayout._7_1_ = 0;
  QString::~QString(&local_1d0);
  local_1b8 = pQVar13;
  pQVar12 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar12);
  dmgRadio = (QRadioButton *)pQVar12;
  pQVar16 = (QRadioButton *)operator_new(0x28);
  sgbRadio._7_1_ = 1;
  tr(&local_200,"DMG (59.7 Hz)",(char *)0x0,-1);
  QRadioButton::QRadioButton(pQVar16,(QString *)&local_200,(QWidget *)0x0);
  sgbRadio._7_1_ = 0;
  QString::~QString(&local_200);
  local_1e8 = pQVar16;
  pQVar16 = (QRadioButton *)operator_new(0x28);
  customLayout._7_1_ = 1;
  tr(&local_228,"SGB (61.1 Hz)",(char *)0x0,-1);
  QRadioButton::QRadioButton(pQVar16,(QString *)&local_228,(QWidget *)0x0);
  customLayout._7_1_ = 0;
  QString::~QString(&local_228);
  local_210 = pQVar16;
  pQVar14 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar14);
  customRadio = (QRadioButton *)pQVar14;
  pQVar16 = (QRadioButton *)operator_new(0x28);
  local_259 = 1;
  tr(&local_258,"Custom",(char *)0x0,-1);
  QRadioButton::QRadioButton(pQVar16,(QString *)&local_258,(QWidget *)0x0);
  local_259 = 0;
  QString::~QString(&local_258);
  local_240 = pQVar16;
  QSpinBox::setRange((int)this->mCustomSpin,0xf);
  pQVar9 = this->mCustomSpin;
  tr(&local_278," Hz",(char *)0x0,-1);
  QSpinBox::setSuffix((QString *)pQVar9);
  QString::~QString(&local_278);
  pQVar1 = customRadio;
  pQVar16 = local_240;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_27c);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pQVar16,(QFlags_conflict1 *)0x0);
  pQVar16 = customRadio;
  pQVar9 = this->mCustomSpin;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_280);
  QBoxLayout::addWidget((QWidget *)pQVar16,(int)pQVar9,(QFlags_conflict1 *)0x0);
  QBoxLayout::addStretch((int)customRadio);
  pQVar1 = dmgRadio;
  pQVar16 = local_1e8;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_284);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pQVar16,(QFlags_conflict1 *)0x0);
  pQVar1 = dmgRadio;
  pQVar16 = local_210;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_288);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pQVar16,(QFlags_conflict1 *)0x0);
  QBoxLayout::addLayout((QLayout *)dmgRadio,(int)customRadio);
  QWidget::setLayout((QLayout *)local_1b8);
  pQVar2 = infoGroup;
  pQVar13 = local_178;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_28c);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar13,(QFlags_conflict1 *)0x1);
  pQVar2 = infoGroup;
  pQVar13 = local_1b8;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_290);
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar13,(QFlags_conflict1 *)0x0);
  pQVar2 = songListGroup;
  pQVar13 = local_108;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&moduleVersionLabel + 4));
  QBoxLayout::addWidget((QWidget *)pQVar2,(int)pQVar13,(QFlags_conflict1 *)0x1);
  QBoxLayout::addLayout((QLayout *)songListGroup,(int)infoGroup);
  pQVar17 = (QLabel *)operator_new(0x28);
  local_305 = 1;
  tr(&local_2d0,"Module revision: %1.%2",(char *)0x0,-1);
  pMVar18 = Module::data((Module *)model_local);
  iVar5 = trackerboy::Module::revisionMajor(pMVar18);
  QString::number((int)&local_2e8,iVar5);
  pMVar18 = Module::data((Module *)model_local);
  iVar5 = trackerboy::Module::revisionMinor(pMVar18);
  QString::number((int)&local_300,iVar5);
  QString::arg<QString,QString>(&local_2b8,&local_2d0,&local_2e8,&local_300);
  QFlags<Qt::WindowType>::QFlags(&local_304);
  QLabel::QLabel(pQVar17,(QString *)&local_2b8,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_304.i
                );
  local_305 = 0;
  QString::~QString(&local_2b8);
  QString::~QString(&local_300);
  QString::~QString(&local_2e8);
  QString::~QString(&local_2d0);
  local_2a0 = pQVar17;
  bVar3 = (bool)QDialogButtonBox::button((StandardButton)this->mDialogButtons);
  QWidget::setEnabled(bVar3);
  local_320 = QDialogButtonBox::accepted;
  local_318 = 0;
  uStack_328 = 0;
  local_330 = 0x1b9;
  type = (ConnectionType)this;
  QObject::connect<void(QDialogButtonBox::*)(),void(ModulePropertiesDialog::*)()>
            (local_310,(offset_in_QDialogButtonBox_to_subr)this->mDialogButtons,
             (Object *)QDialogButtonBox::accepted,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_310);
  local_348 = QDialogButtonBox::rejected;
  local_340 = 0;
  uStack_350 = 0;
  local_358 = 0x1c1;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_338,(offset_in_QDialogButtonBox_to_subr)this->mDialogButtons,
             (Object *)QDialogButtonBox::rejected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_338);
  pQVar13 = songListGroup;
  pQVar17 = local_2a0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_35c);
  QBoxLayout::addWidget((QWidget *)pQVar13,(int)pQVar17,(QFlags_conflict1 *)0x0);
  pQVar13 = songListGroup;
  pQVar10 = this->mDialogButtons;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_360);
  QBoxLayout::addWidget((QWidget *)pQVar13,(int)pQVar10,(QFlags_conflict1 *)0x0);
  QLayout::setSizeConstraint((SizeConstraint)songListGroup);
  QWidget::setLayout((QLayout *)this);
  pQVar8 = this->mTitleEdit;
  tr(&local_378,"Title",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar8);
  QString::~QString(&local_378);
  pQVar8 = this->mArtistEdit;
  tr(&local_390,"Artist",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar8);
  QString::~QString(&local_390);
  pQVar8 = this->mCopyrightEdit;
  tr((QString *)&selectionModel,"Copyright",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar8);
  QString::~QString((QString *)&selectionModel);
  local_3b0 = QAbstractItemView::selectionModel();
  QObject::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(ModulePropertiesDialog::*)()>
            (local_3b8,local_3b0,(Object *)QItemSelectionModel::selectionChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_3b8);
  pMStack_3e0 = Module::data(this->mModule);
  pQVar8 = this->mTitleEdit;
  pIVar19 = trackerboy::Module::title(pMStack_3e0);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(&local_3e1,pQVar8,pIVar19);
  pQVar8 = this->mArtistEdit;
  pIVar19 = trackerboy::Module::artist(pMStack_3e0);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(&local_3e1,pQVar8,pIVar19);
  pQVar8 = this->mCopyrightEdit;
  pIVar19 = trackerboy::Module::copyright(pMStack_3e0);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(&local_3e1,pQVar8,pIVar19);
  iVar5 = trackerboy::Module::system(pMStack_3e0,(char *)pQVar8);
  cVar4 = (char)iVar5;
  if (cVar4 == '\0') {
    QAbstractButton::setChecked(SUB81(local_1e8,0));
  }
  else if (cVar4 == '\x01') {
    QAbstractButton::setChecked(SUB81(local_210,0));
  }
  else if (cVar4 == '\x02') {
    QAbstractButton::setChecked(SUB81(local_240,0));
  }
  pQVar9 = this->mCustomSpin;
  trackerboy::Module::customFramerate(pMStack_3e0);
  QSpinBox::setValue((int)pQVar9);
  pQVar9 = this->mCustomSpin;
  QAbstractButton::isChecked();
  QWidget::setEnabled(SUB81(pQVar9,0));
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_1e8);
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_210);
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_240);
  updateSongButtons(this);
  local_400 = QAbstractButton::clicked;
  local_3f8 = 0;
  local_410 = add;
  uStack_408 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_3f0,(offset_in_QAbstractButton_to_subr)this->mAddButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_3f0);
  local_428 = QAbstractButton::clicked;
  local_420 = 0;
  local_438 = remove;
  uStack_430 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_418,(offset_in_QAbstractButton_to_subr)this->mRemoveButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_418);
  local_450 = QAbstractButton::clicked;
  local_448 = 0;
  local_460 = duplicate;
  uStack_458 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_440,(offset_in_QAbstractButton_to_subr)this->mDuplicateButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_440);
  local_478 = QAbstractButton::clicked;
  local_470 = 0;
  local_488 = moveUp;
  uStack_480 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_468,(offset_in_QAbstractButton_to_subr)this->mMoveUpButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_468);
  local_4a0 = QAbstractButton::clicked;
  local_498 = 0;
  local_4b0 = moveDown;
  uStack_4a8 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_490,(offset_in_QAbstractButton_to_subr)this->mMoveDownButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_490);
  setInfoDirty.this = (ModulePropertiesDialog *)QWidget::setEnabled;
  QObject::connect<void(QAbstractButton::*)(bool),void(QWidget::*)(bool)>
            (local_4b8,(offset_in_QAbstractButton_to_subr)local_240,
             (Object *)QAbstractButton::toggled,0,(ConnectionType)this->mCustomSpin);
  QMetaObject::Connection::~Connection((Connection *)local_4b8);
  local_500 = QLineEdit::textChanged;
  local_4f8 = 0;
  local_4f0 = this;
  local_4e0 = this;
  QObject::
  connect<void(QLineEdit::*)(QString_const&),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__1>
            (local_4e8,(offset_in_QLineEdit_to_subr)this->mTitleEdit,
             (QObject *)QLineEdit::textChanged,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_4e8);
  local_510 = local_4e0;
  local_520 = QLineEdit::textChanged;
  local_518 = 0;
  QObject::
  connect<void(QLineEdit::*)(QString_const&),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__1>
            (local_508,(offset_in_QLineEdit_to_subr)this->mArtistEdit,
             (QObject *)QLineEdit::textChanged,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_508);
  setSystemDirty.this = (ModulePropertiesDialog *)QLineEdit::textChanged;
  QObject::
  connect<void(QLineEdit::*)(QString_const&),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__1>
            (local_528,(offset_in_QLineEdit_to_subr)this->mCopyrightEdit,
             (QObject *)QLineEdit::textChanged,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_528);
  pQVar11 = this->mFramerateRadios;
  local_560 = QButtonGroup::buttonToggled;
  local_558 = 0;
  local_548 = this;
  local_578 = (QObject *)
              QNonConstOverload<QAbstractButton*,bool>::operator()
                        ((QNonConstOverload<QAbstractButton*,bool> *)
                         &qOverload<QAbstractButton*,bool>,
                         (offset_in_QButtonGroup_to_subr)QButtonGroup::buttonToggled);
  local_568 = local_548;
  QObject::
  connect<void(QButtonGroup::*)(QAbstractButton*,bool),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__2>
            (local_550,(offset_in_QButtonGroup_to_subr)pQVar11,local_578,slot,type);
  QMetaObject::Connection::~Connection((Connection *)local_550);
  pQVar9 = this->mCustomSpin;
  context = (QObject *)
            QNonConstOverload<int>::operator()
                      ((QNonConstOverload<int> *)&qOverload<int>,
                       (offset_in_QSpinBox_to_subr)QSpinBox::valueChanged);
  QObject::
  connect<void(QSpinBox::*)(int),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__2>
            (local_580,(offset_in_QSpinBox_to_subr)pQVar9,context,slot_00,type);
  QMetaObject::Connection::~Connection((Connection *)local_580);
  return;
}

Assistant:

ModulePropertiesDialog::ModulePropertiesDialog(Module &mod, SongListModel &model, QWidget *parent) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mModule(mod),
    mModel(model),
    mDirty(Clean),
    mWarnRemove(true),
    mSongList(new QListView),
    mAddButton(new QPushButton(tr("Add"))),
    mRemoveButton(new QPushButton(tr("Remove"))),
    mDuplicateButton(new QPushButton(tr("Duplicate"))),
    mMoveUpButton(new QPushButton(tr("Move up"))),
    mMoveDownButton(new QPushButton(tr("Move down"))),
    mTitleEdit(new QLineEdit),
    mArtistEdit(new QLineEdit),
    mCopyrightEdit(new QLineEdit),
    mCustomSpin(new QSpinBox),
    mDialogButtons(new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel)),
    mFramerateRadios(new QButtonGroup(this))
{
    setModal(true);
    setWindowTitle(tr("Module properties"));


    auto layout = new QVBoxLayout;

    // song list group
    auto songListGroup = new QGroupBox(tr("Song list"));
    auto songListLayout = new QHBoxLayout;
    mSongList->setModel(&model);

    auto songButtonLayout = new QVBoxLayout;
    songButtonLayout->addWidget(mAddButton);
    songButtonLayout->addWidget(mRemoveButton);
    songButtonLayout->addWidget(mDuplicateButton);
    auto line = new QFrame;
    line->setFrameShape(QFrame::HLine);
    line->setFrameShadow(QFrame::Sunken);
    songButtonLayout->addWidget(line);
    songButtonLayout->addWidget(mMoveUpButton);
    songButtonLayout->addWidget(mMoveDownButton);
    songButtonLayout->addStretch();

    songListLayout->addWidget(mSongList, 1);
    songListLayout->addLayout(songButtonLayout);
    songListGroup->setLayout(songListLayout);

    auto propLayout = new QHBoxLayout;

    auto infoGroup = new QGroupBox(tr("Information"));
    auto infoLayout = new QVBoxLayout;
    infoLayout->addWidget(mTitleEdit);
    infoLayout->addWidget(mArtistEdit);
    infoLayout->addWidget(mCopyrightEdit);
    infoGroup->setLayout(infoLayout);

    auto framerateGroup = new QGroupBox(tr("Framerate"));
    auto framerateLayout = new QVBoxLayout;
    auto dmgRadio = new QRadioButton(tr("DMG (59.7 Hz)"));
    auto sgbRadio = new QRadioButton(tr("SGB (61.1 Hz)"));
    auto customLayout = new QHBoxLayout;
    auto customRadio = new QRadioButton(tr("Custom"));
    mCustomSpin->setRange(15, 4096); // theres an issue with < 15 Hz framerates
    mCustomSpin->setSuffix(tr(" Hz"));
    customLayout->addWidget(customRadio);
    customLayout->addWidget(mCustomSpin);
    customLayout->addStretch();
    framerateLayout->addWidget(dmgRadio);
    framerateLayout->addWidget(sgbRadio);
    framerateLayout->addLayout(customLayout);
    framerateGroup->setLayout(framerateLayout);

    propLayout->addWidget(infoGroup, 1);
    propLayout->addWidget(framerateGroup);


    layout->addWidget(songListGroup, 1);
    layout->addLayout(propLayout);
    auto moduleVersionLabel = new QLabel(tr("Module revision: %1.%2").arg(
                                             QString::number(mod.data().revisionMajor()),
                                             QString::number(mod.data().revisionMinor())));

    mDialogButtons->button(QDialogButtonBox::Ok)->setEnabled(false);
    lazyconnect(mDialogButtons, accepted, this, accept);
    lazyconnect(mDialogButtons, rejected, this, reject);

    layout->addWidget(moduleVersionLabel);
    layout->addWidget(mDialogButtons);

    layout->setSizeConstraint(QLayout::SetFixedSize);
    setLayout(layout);


    mTitleEdit->setPlaceholderText(tr("Title"));
    mArtistEdit->setPlaceholderText(tr("Artist"));
    mCopyrightEdit->setPlaceholderText(tr("Copyright"));

    auto selectionModel = mSongList->selectionModel();
    lazyconnect(selectionModel, selectionChanged, this, updateSongButtons);

    auto const& moddata = mModule.data();
    auto setInfoEdit = [](QLineEdit *edit, trackerboy::InfoStr const& str) {
        edit->setMaxLength((int)str.size());
        edit->setText(QString::fromUtf8(str.data(), (int)str.length()));
    };
    setInfoEdit(mTitleEdit, moddata.title());
    setInfoEdit(mArtistEdit, moddata.artist());
    setInfoEdit(mCopyrightEdit, moddata.copyright());

    switch (moddata.system()) {
        case trackerboy::System::dmg:
            dmgRadio->setChecked(true);
            break;
        case trackerboy::System::sgb:
            sgbRadio->setChecked(true);
            break;
        case trackerboy::System::custom:
            customRadio->setChecked(true);
            break;
    }
    mCustomSpin->setValue(moddata.customFramerate());
    mCustomSpin->setEnabled(customRadio->isChecked());



    mFramerateRadios->addButton(dmgRadio, (int)trackerboy::System::dmg);
    mFramerateRadios->addButton(sgbRadio, (int)trackerboy::System::sgb);
    mFramerateRadios->addButton(customRadio, (int)trackerboy::System::custom);


    updateSongButtons();

    lazyconnect(mAddButton, clicked, this, add);
    lazyconnect(mRemoveButton, clicked, this, remove);
    lazyconnect(mDuplicateButton, clicked, this, duplicate);
    lazyconnect(mMoveUpButton, clicked, this, moveUp);
    lazyconnect(mMoveDownButton, clicked, this, moveDown);
    lazyconnect(customRadio, toggled, mCustomSpin, setEnabled);

    auto setInfoDirty = [this]() { setDirty(DirtyInfo); };
    connect(mTitleEdit, &QLineEdit::textChanged, this, setInfoDirty);
    connect(mArtistEdit, &QLineEdit::textChanged, this, setInfoDirty);
    connect(mCopyrightEdit, &QLineEdit::textChanged, this, setInfoDirty);

    auto setSystemDirty = [this]() { setDirty(DirtySystem); };
    connect(mFramerateRadios, qOverload<QAbstractButton*, bool>(&QButtonGroup::buttonToggled), this, setSystemDirty);
    connect(mCustomSpin, qOverload<int>(&QSpinBox::valueChanged), this, setSystemDirty);

}